

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_item_scheduler.cc
# Opt level: O2

void __thiscall WorkItemScheduler::start(WorkItemScheduler *this)

{
  pointer pWVar1;
  vector<Worker,_std::allocator<Worker>_> *__range1;
  Worker *w;
  pointer this_00;
  WorkItemScheduler *local_38;
  thread local_30;
  code *local_28;
  undefined8 local_20;
  
  this->active_ = true;
  pWVar1 = (this->workers_).super__Vector_base<Worker,_std::allocator<Worker>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->workers_).super__Vector_base<Worker,_std::allocator<Worker>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pWVar1; this_00 = this_00 + 1) {
    Worker::start(this_00);
  }
  local_28 = work_dispatch;
  local_20 = 0;
  local_38 = this;
  std::thread::thread<void(WorkItemScheduler::*)(),WorkItemScheduler*,void>
            (&local_30,(type *)&local_28,&local_38);
  std::thread::operator=(&this->dispatcher_thread_,&local_30);
  std::thread::~thread(&local_30);
  return;
}

Assistant:

void WorkItemScheduler::start()
{
    this->active_ = true;

    for (auto& w : this->workers_)
        w.start();

    this->dispatcher_thread_ = std::thread(&WorkItemScheduler::work_dispatch,
                                           this);
}